

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::error<std::basic_string_view<char,std::char_traits<char>>const&>
          (ValidationContext *this,IssueError *issue,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args_00;
  string_view fmt;
  allocator<char> local_81;
  undefined1 local_80 [40];
  string local_58;
  char *local_38;
  size_t local_30;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_80[0] = (issue->super_Issue).type;
  local_80._2_2_ = (issue->super_Issue).id;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(local_80 + 8),&(issue->super_Issue).message,&local_81);
  local_30 = args->_M_len;
  local_38 = args->_M_str;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)&local_38;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_58,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            (&this->callback,(ValidationReport *)local_80);
  ValidationReport::~ValidationReport((ValidationReport *)local_80);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }